

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void embree::SceneGraph::set_time_range(Ref<embree::SceneGraph::Node> *node,BBox1f *time_range)

{
  Node *pNVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  Ref<embree::SceneGraph::Node> local_30;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar3 == (long *)0x0) {
      plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar3 == (long *)0x0) {
        plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar3 == (long *)0x0) {
          plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
          if (plVar3 == (long *)0x0) {
            plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
            if (plVar3 == (long *)0x0) {
              plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GridMeshNode::typeinfo,0);
              if (plVar3 == (long *)0x0) {
                plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&HairSetNode::typeinfo,0);
                if (plVar3 == (long *)0x0) {
                  plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&PointSetNode::typeinfo,0);
                  if (plVar3 == (long *)0x0) {
                    plVar3 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&SubdivMeshNode::typeinfo
                                                    ,0);
                    if (plVar3 != (long *)0x0) {
                      (**(code **)(*plVar3 + 0x10))(plVar3);
                      *(float *)(plVar3 + 0xd) = time_range->lower;
                      *(float *)((long)plVar3 + 0x6c) = time_range->upper;
                      (**(code **)(*plVar3 + 0x18))(plVar3);
                    }
                  }
                  else {
                    (**(code **)(*plVar3 + 0x10))(plVar3);
                    *(float *)(plVar3 + 0xd) = time_range->lower;
                    *(float *)((long)plVar3 + 0x6c) = time_range->upper;
                    (**(code **)(*plVar3 + 0x18))(plVar3);
                  }
                }
                else {
                  (**(code **)(*plVar3 + 0x10))(plVar3);
                  *(float *)(plVar3 + 0xd) = time_range->lower;
                  *(float *)((long)plVar3 + 0x6c) = time_range->upper;
                  (**(code **)(*plVar3 + 0x18))(plVar3);
                }
              }
              else {
                (**(code **)(*plVar3 + 0x10))(plVar3);
                *(float *)(plVar3 + 0xd) = time_range->lower;
                *(float *)((long)plVar3 + 0x6c) = time_range->upper;
                (**(code **)(*plVar3 + 0x18))(plVar3);
              }
            }
            else {
              (**(code **)(*plVar3 + 0x10))(plVar3);
              *(float *)(plVar3 + 0xd) = time_range->lower;
              *(float *)((long)plVar3 + 0x6c) = time_range->upper;
              (**(code **)(*plVar3 + 0x18))(plVar3);
            }
          }
          else {
            (**(code **)(*plVar3 + 0x10))(plVar3);
            *(float *)(plVar3 + 0xd) = time_range->lower;
            *(float *)((long)plVar3 + 0x6c) = time_range->upper;
            (**(code **)(*plVar3 + 0x18))(plVar3);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x10))(plVar3);
          uVar5 = 0;
          while( true ) {
            if ((ulong)(plVar3[0xe] - plVar3[0xd] >> 3) <= uVar5) break;
            pNVar1 = *(Node **)(plVar3[0xd] + uVar5 * 8);
            local_30.ptr = pNVar1;
            if (pNVar1 != (Node *)0x0) {
              (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
            }
            set_time_range(&local_30,time_range);
            if (pNVar1 != (Node *)0x0) {
              (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
            }
            uVar5 = uVar5 + 1;
          }
          (**(code **)(*plVar3 + 0x18))(plVar3);
        }
      }
      else {
        (**(code **)(*plVar3 + 0x10))(plVar3);
        lVar4 = 4;
        uVar5 = 0;
        while( true ) {
          lVar2 = plVar3[0xd];
          if ((ulong)((plVar3[0xe] - lVar2) / 0x30) <= uVar5) break;
          *(float *)(lVar2 + -4 + lVar4) = time_range->lower;
          *(float *)(lVar2 + lVar4) = time_range->upper;
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x30;
        }
        (**(code **)(*plVar3 + 0x18))(plVar3,uVar5,(plVar3[0xe] - lVar2) % 0x30);
      }
    }
    else {
      (**(code **)(*plVar3 + 0x10))(plVar3);
      *(float *)(plVar3 + 0xd) = time_range->lower;
      *(float *)((long)plVar3 + 0x6c) = time_range->upper;
      (**(code **)(*plVar3 + 0x18))(plVar3);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }